

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int experimental_utilization_query_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  long in_RCX;
  size_t *in_RDX;
  size_t *in_RSI;
  size_t *in_RDI;
  long *in_R8;
  long in_R9;
  void *unaff_retaddr;
  tsdn_t *in_stack_00000008;
  inspect_extent_util_stats_verbose_t *util_stats;
  void *ptr;
  int ret;
  size_t *in_stack_00000240;
  void **in_stack_00000248;
  int local_3c;
  
  if ((((in_RCX == 0) || (in_R8 == (long *)0x0)) || (*in_R8 != 0x30)) || (in_R9 == 0)) {
    local_3c = 0x16;
  }
  else if ((in_R9 == 0) || (in_stack_00000008 == (tsdn_t *)0x8)) {
    duckdb_je_inspect_extent_util_stats_verbose_get
              (in_stack_00000008,unaff_retaddr,in_RDI,in_RDI,in_RSI,in_RDX,in_stack_00000240,
               in_stack_00000248);
    local_3c = 0;
  }
  else {
    local_3c = 0x16;
  }
  return local_3c;
}

Assistant:

static int
experimental_utilization_query_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	assert(sizeof(inspect_extent_util_stats_verbose_t)
	    == sizeof(void *) + sizeof(size_t) * 5);

	if (oldp == NULL || oldlenp == NULL
	    || *oldlenp != sizeof(inspect_extent_util_stats_verbose_t)
	    || newp == NULL) {
		ret = EINVAL;
		goto label_return;
	}

	void *ptr = NULL;
	WRITE(ptr, void *);
	inspect_extent_util_stats_verbose_t *util_stats
	    = (inspect_extent_util_stats_verbose_t *)oldp;
	inspect_extent_util_stats_verbose_get(tsd_tsdn(tsd), ptr,
	    &util_stats->nfree, &util_stats->nregs, &util_stats->size,
	    &util_stats->bin_nfree, &util_stats->bin_nregs,
	    &util_stats->slabcur_addr);
	ret = 0;

label_return:
	return ret;
}